

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

tdefl_status
duckdb_miniz::tdefl_compress
          (tdefl_compressor *d,void *pIn_buf,size_t *pIn_buf_size,void *pOut_buf,
          size_t *pOut_buf_size,tdefl_flush flush)

{
  mz_uint *pmVar1;
  mz_uint16 *__s;
  mz_uint16 *pmVar2;
  byte bVar3;
  mz_uint8 mVar4;
  mz_uint8 mVar5;
  ushort uVar6;
  mz_uint mVar7;
  uint uVar8;
  mz_uint8 *pmVar9;
  tdefl_status tVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  mz_ulong mVar15;
  uint uVar16;
  mz_uint mVar17;
  ulong uVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  mz_uint8 *pmVar28;
  uint local_90;
  int local_48;
  ulong uVar23;
  
  if (d == (tdefl_compressor *)0x0) {
    if (pIn_buf_size != (size_t *)0x0) {
      *pIn_buf_size = 0;
    }
    if (pOut_buf_size != (size_t *)0x0) {
      *pOut_buf_size = 0;
    }
    return TDEFL_STATUS_BAD_PARAM;
  }
  d->m_pIn_buf = pIn_buf;
  d->m_pIn_buf_size = pIn_buf_size;
  d->m_pOut_buf = pOut_buf;
  d->m_pOut_buf_size = pOut_buf_size;
  d->m_pSrc = (mz_uint8 *)pIn_buf;
  if (pIn_buf_size == (size_t *)0x0) {
    sVar26 = 0;
  }
  else {
    sVar26 = *pIn_buf_size;
  }
  d->m_src_buf_left = sVar26;
  d->m_out_buf_ofs = 0;
  d->m_flush = flush;
  if ((((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) ==
        (pOut_buf != (void *)0x0 || pOut_buf_size != (size_t *)0x0)) &&
      (d->m_prev_return_status == TDEFL_STATUS_OKAY)) &&
     (flush == TDEFL_FINISH || d->m_wants_to_finish == 0)) {
    if (((pIn_buf_size == (size_t *)0x0) || (pIn_buf != (void *)0x0)) || (*pIn_buf_size == 0)) {
      if (((pOut_buf_size == (size_t *)0x0) || (pOut_buf != (void *)0x0)) || (*pOut_buf_size == 0))
      {
        d->m_wants_to_finish = d->m_wants_to_finish | (uint)(flush == TDEFL_FINISH);
        if ((d->m_output_flush_remaining == 0) && (d->m_finished == 0)) {
          __s = d->m_next;
          local_48 = (int)d + 0x92aa;
          pmVar28 = (mz_uint8 *)pIn_buf;
          do {
            do {
              if (sVar26 == 0) {
                if ((flush != TDEFL_NO_FLUSH) && (mVar17 = d->m_lookahead_size, mVar17 != 0))
                goto LAB_01b336a3;
                uVar27 = 0;
LAB_01b33e9f:
                d->m_pSrc = pmVar28;
                d->m_src_buf_left = uVar27;
                goto LAB_01b33eb1;
              }
              mVar17 = d->m_lookahead_size;
LAB_01b336a3:
              uVar22 = d->m_dict_size;
              if (uVar22 + mVar17 < 2) {
                uVar27 = sVar26;
                for (uVar14 = 0; iVar13 = (int)uVar14, sVar26 != uVar14; uVar14 = uVar14 + 1) {
                  if (0x101 < mVar17 + iVar13) goto LAB_01b33873;
                  bVar3 = pmVar28[uVar14];
                  mVar7 = d->m_lookahead_pos;
                  uVar11 = mVar17 + iVar13 + mVar7 & 0x7fff;
                  d->m_dict[uVar11] = bVar3;
                  if (uVar11 < 0x101) {
                    d->m_dict[(ulong)uVar11 + 0x8000] = bVar3;
                  }
                  d->m_lookahead_size = mVar17 + iVar13 + 1;
                  if (2 < mVar17 + uVar22 + 1 + iVar13) {
                    uVar11 = (mVar17 - 2) + iVar13 + mVar7 & 0x7fff;
                    uVar20 = (uint)bVar3 ^
                             (uint)d->m_dict[(mVar7 + mVar17 + iVar13) - 1 & 0x7fff] << 5 ^
                             (d->m_dict[uVar11] & 0x1f) << 10;
                    d->m_next[uVar11] = d->m_hash[uVar20];
                    d->m_hash[uVar20] = ((short)mVar7 + (short)(mVar17 + iVar13)) - 2;
                  }
                  uVar27 = uVar27 - 1;
                }
                uVar27 = 0;
LAB_01b33873:
                uVar11 = mVar17 + iVar13;
              }
              else {
                mVar7 = d->m_lookahead_pos;
                uVar20 = (mVar7 + mVar17) - 2;
                uVar24 = mVar7 + mVar17;
                uVar27 = (ulong)((uint)d->m_dict[(mVar7 + mVar17) - 1 & 0x7fff] ^
                                (uint)d->m_dict[uVar20 & 0x7fff] << 5);
                uVar14 = sVar26 & 0xffffffff;
                if (0x102 - mVar17 <= sVar26) {
                  uVar14 = (ulong)(0x102 - mVar17);
                }
                uVar11 = (int)uVar14 + mVar17;
                d->m_lookahead_size = uVar11;
                for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
                  uVar24 = uVar24 & 0x7fff;
                  bVar3 = pmVar28[uVar18];
                  d->m_dict[uVar24] = bVar3;
                  if (uVar24 < 0x101) {
                    d->m_dict[(ulong)uVar24 + 0x8000] = bVar3;
                  }
                  uVar27 = (ulong)(((uint)uVar27 & 0x3ff) << 5 ^ (uint)bVar3);
                  d->m_next[uVar20 & 0x7fff] = d->m_hash[uVar27];
                  d->m_hash[uVar27] = (mz_uint16)uVar20;
                  uVar24 = uVar24 + 1;
                  uVar20 = uVar20 + 1;
                }
                uVar27 = sVar26 - uVar14;
              }
              pmVar28 = pmVar28 + uVar14;
              uVar20 = 0x8000 - uVar11;
              if (uVar22 <= 0x8000 - uVar11) {
                uVar20 = uVar22;
              }
              d->m_dict_size = uVar20;
              if ((flush == TDEFL_NO_FLUSH) && (uVar11 < 0x102)) goto LAB_01b33e9f;
              uVar22 = d->m_saved_match_len;
              uVar14 = (ulong)uVar22;
              if (uVar22 == 0) {
                uVar14 = 2;
              }
              uVar21 = (uint)uVar14;
              uVar24 = d->m_flags;
              uVar8 = d->m_lookahead_pos;
              uVar16 = uVar8 & 0x7fff;
              uVar18 = (ulong)uVar16;
              if ((uVar24 & 0x90000) == 0) {
                if (uVar21 < uVar11) {
                  mVar17 = d->m_max_probes[0x1f < uVar21];
                  local_90 = 0;
                  uVar23 = uVar18;
                  do {
                    uVar12 = (uint)uVar14;
                    mVar4 = d->m_dict[(uVar16 + uVar21) - 1];
                    mVar5 = d->m_dict[uVar16 + uVar21];
                    do {
                      mVar7 = mVar17 - 1;
                      do {
                        mVar17 = mVar7;
                        if ((mVar17 == 0) || (uVar6 = __s[uVar23], uVar6 == 0)) goto LAB_01b33ae6;
                        uVar25 = uVar8 - uVar6 & 0xffff;
                        if (uVar20 < uVar25) goto LAB_01b33ae6;
                        uVar21 = uVar6 & 0x7fff;
                        uVar23 = (ulong)uVar21;
                        uVar21 = uVar12 + uVar21;
                        if ((d->m_dict[uVar21] == mVar5) && (d->m_dict[uVar21 - 1] == mVar4)) break;
                        uVar6 = __s[uVar23];
                        if (uVar6 == 0) goto LAB_01b33ae6;
                        uVar25 = uVar8 - uVar6 & 0xffff;
                        if (uVar20 < uVar25) goto LAB_01b33ae6;
                        uVar21 = uVar6 & 0x7fff;
                        uVar23 = (ulong)uVar21;
                        uVar21 = uVar12 + uVar21;
                        if ((d->m_dict[uVar21] == mVar5) && (d->m_dict[uVar21 - 1] == mVar4)) break;
                        uVar6 = __s[uVar23];
                        if (uVar6 == 0) goto LAB_01b33ae6;
                        uVar25 = uVar8 - uVar6 & 0xffff;
                        if (uVar20 < uVar25) goto LAB_01b33ae6;
                        uVar21 = uVar6 & 0x7fff;
                        uVar23 = (ulong)uVar21;
                        uVar21 = uVar12 + uVar21;
                        mVar7 = mVar17 - 1;
                      } while ((d->m_dict[uVar21] != mVar5) || (d->m_dict[uVar21 - 1] != mVar4));
                      if (uVar25 == 0) goto LAB_01b33ae6;
                      for (uVar14 = 0; uVar11 != (uint)uVar14; uVar14 = uVar14 + 1) {
                        if (d->m_dict[uVar14 + uVar18] != d->m_dict[uVar14 + uVar23])
                        goto LAB_01b33a8d;
                      }
                      uVar14 = (ulong)uVar11;
LAB_01b33a8d:
                      uVar21 = (uint)uVar14;
                    } while (uVar21 <= uVar12);
                    local_90 = uVar25;
                    uVar12 = uVar11;
                    if (uVar21 == uVar11) goto LAB_01b33ae6;
                    uVar14 = uVar14 & 0xffffffff;
                  } while( true );
                }
LAB_01b33ac2:
                local_90 = 0;
                uVar12 = uVar21;
              }
              else {
                if ((uVar24 >> 0x13 & 1) != 0 || uVar20 == 0) goto LAB_01b33ac2;
                uVar14 = 0;
                do {
                  if (uVar11 == uVar14) goto LAB_01b33ad5;
                  iVar13 = (int)uVar14;
                  uVar14 = uVar14 + 1;
                } while (d->m_dict[(uVar8 & 0x7fff) + iVar13] == d->m_dict[uVar8 - 1 & 0x7fff]);
                uVar11 = (int)uVar14 - 1;
LAB_01b33ad5:
                local_90 = (uint)(2 < uVar11);
                uVar12 = uVar11;
                if (2 >= uVar11) {
                  uVar12 = 0;
                }
              }
LAB_01b33ae6:
              if (((uVar12 == 3 && 0x1fff < local_90) || (uVar16 == local_90)) ||
                 (((uVar24 >> 0x11 & 1) != 0 && (uVar12 < 6)))) {
                mVar17 = d->m_total_lz_bytes;
                pbVar19 = d->m_pLZ_code_buf;
                if (uVar22 != 0) {
LAB_01b33b22:
                  mVar7 = d->m_saved_match_dist;
                  d->m_total_lz_bytes = mVar17 + uVar22;
                  *pbVar19 = (byte)(uVar22 - 3);
                  uVar11 = mVar7 - 1;
                  d->m_pLZ_code_buf[1] = (mz_uint8)uVar11;
                  d->m_pLZ_code_buf[2] = (mz_uint8)(uVar11 >> 8);
                  d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                  *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                  pmVar1 = &d->m_num_flags_left;
                  *pmVar1 = *pmVar1 - 1;
                  if (*pmVar1 == 0) {
                    d->m_num_flags_left = 8;
                    pmVar9 = d->m_pLZ_code_buf;
                    d->m_pLZ_code_buf = pmVar9 + 1;
                    d->m_pLZ_flags = pmVar9;
                  }
                  pbVar19 = s_tdefl_large_dist_sym + (uVar11 >> 8 & 0x7f);
                  if (uVar11 < 0x200) {
                    pbVar19 = s_tdefl_small_dist_sym + (uVar11 & 0x1ff);
                  }
                  pmVar2 = d->m_huff_count[1] + *pbVar19;
                  *pmVar2 = *pmVar2 + 1;
                  if (2 < uVar22) {
                    pmVar2 = d->m_huff_count[0] +
                             *(ushort *)(s_tdefl_len_sym + (ulong)(uVar22 - 3) * 2);
                    *pmVar2 = *pmVar2 + 1;
                  }
                  uVar12 = d->m_saved_match_len - 1;
                  goto LAB_01b33bcc;
                }
LAB_01b33d96:
                bVar3 = d->m_dict[uVar18];
                d->m_total_lz_bytes = mVar17 + 1;
                d->m_pLZ_code_buf = pbVar19 + 1;
                *pbVar19 = bVar3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar9 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar9 + 1;
                  d->m_pLZ_flags = pmVar9;
                }
                pmVar2 = d->m_huff_count[0] + bVar3;
                *pmVar2 = *pmVar2 + 1;
LAB_01b33ddc:
                uVar12 = 1;
              }
              else if (uVar22 == 0) {
                if (local_90 == 0) {
                  mVar17 = d->m_total_lz_bytes;
                  pbVar19 = d->m_pLZ_code_buf;
                  goto LAB_01b33d96;
                }
                if (((d->m_greedy_parsing == 0) && ((uVar24 >> 0x10 & 1) == 0)) && (uVar12 < 0x80))
                goto LAB_01b33e63;
                d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
                *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
                uVar22 = local_90 - 1;
                d->m_pLZ_code_buf[1] = (mz_uint8)uVar22;
                d->m_pLZ_code_buf[2] = (mz_uint8)(uVar22 >> 8);
                d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar9 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar9 + 1;
                  d->m_pLZ_flags = pmVar9;
                }
                pbVar19 = s_tdefl_large_dist_sym + (uVar22 >> 8 & 0x7f);
                if (local_90 < 0x201) {
                  pbVar19 = s_tdefl_small_dist_sym + (uVar22 & 0x1ff);
                }
                pmVar2 = d->m_huff_count[1] + *pbVar19;
                *pmVar2 = *pmVar2 + 1;
                if (2 < uVar12) {
                  pmVar2 = d->m_huff_count[0] +
                           *(ushort *)(s_tdefl_len_sym + (ulong)(uVar12 - 3) * 2);
                  *pmVar2 = *pmVar2 + 1;
                }
              }
              else {
                mVar17 = d->m_total_lz_bytes;
                pbVar19 = d->m_pLZ_code_buf;
                if (uVar12 <= uVar22) goto LAB_01b33b22;
                uVar22 = d->m_saved_lit;
                d->m_total_lz_bytes = mVar17 + 1;
                d->m_pLZ_code_buf = pbVar19 + 1;
                *pbVar19 = (byte)uVar22;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar9 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar9 + 1;
                  d->m_pLZ_flags = pmVar9;
                }
                pmVar2 = d->m_huff_count[0] + (uVar22 & 0xff);
                *pmVar2 = *pmVar2 + 1;
                if (uVar12 < 0x80) {
LAB_01b33e63:
                  d->m_saved_lit = (uint)d->m_dict[uVar18];
                  d->m_saved_match_dist = local_90;
                  d->m_saved_match_len = uVar12;
                  goto LAB_01b33ddc;
                }
                d->m_total_lz_bytes = d->m_total_lz_bytes + uVar12;
                *d->m_pLZ_code_buf = (mz_uint8)(uVar12 - 3);
                local_90 = local_90 - 1;
                d->m_pLZ_code_buf[1] = (mz_uint8)local_90;
                d->m_pLZ_code_buf[2] = (mz_uint8)(local_90 >> 8);
                d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
                *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
                pmVar1 = &d->m_num_flags_left;
                *pmVar1 = *pmVar1 - 1;
                if (*pmVar1 == 0) {
                  d->m_num_flags_left = 8;
                  pmVar9 = d->m_pLZ_code_buf;
                  d->m_pLZ_code_buf = pmVar9 + 1;
                  d->m_pLZ_flags = pmVar9;
                }
                pbVar19 = s_tdefl_large_dist_sym + (local_90 >> 8 & 0x7f);
                if (local_90 < 0x200) {
                  pbVar19 = s_tdefl_small_dist_sym + (local_90 & 0x1ff);
                }
                pmVar2 = d->m_huff_count[1] + *pbVar19;
                *pmVar2 = *pmVar2 + 1;
                pmVar2 = d->m_huff_count[0] + *(ushort *)(s_tdefl_len_sym + (ulong)(uVar12 - 3) * 2)
                ;
                *pmVar2 = *pmVar2 + 1;
LAB_01b33bcc:
                d->m_saved_match_len = 0;
              }
              d->m_lookahead_pos = d->m_lookahead_pos + uVar12;
              d->m_lookahead_size = d->m_lookahead_size - uVar12;
              uVar12 = uVar12 + d->m_dict_size;
              if (0x7fff < uVar12) {
                uVar12 = 0x8000;
              }
              d->m_dict_size = uVar12;
              sVar26 = uVar27;
            } while ((d->m_pLZ_code_buf <= d->m_lz_code_buf + 0xfff8) &&
                    ((d->m_total_lz_bytes < 0x7c01 ||
                     (((uint)(((int)d->m_pLZ_code_buf - local_48) * 0x73) >> 7 < d->m_total_lz_bytes
                      && ((d->m_flags & 0x80000) == 0))))));
            d->m_pSrc = pmVar28;
            d->m_src_buf_left = uVar27;
            iVar13 = tdefl_flush_block(d,0);
          } while (iVar13 == 0);
          if (iVar13 < 0) {
LAB_01b33f46:
            return d->m_prev_return_status;
          }
LAB_01b33eb1:
          if ((pIn_buf != (void *)0x0) && ((d->m_flags & 0x3000) != 0)) {
            mVar15 = mz_adler32((ulong)d->m_adler32,(uchar *)pIn_buf,(long)d->m_pSrc - (long)pIn_buf
                               );
            d->m_adler32 = (mz_uint)mVar15;
          }
          if ((((flush != TDEFL_NO_FLUSH) && (d->m_lookahead_size == 0)) && (d->m_src_buf_left == 0)
              ) && (d->m_output_flush_remaining == 0)) {
            iVar13 = tdefl_flush_block(d,flush);
            if (iVar13 < 0) goto LAB_01b33f46;
            d->m_finished = (uint)(flush == TDEFL_FINISH);
            if (flush == TDEFL_FULL_FLUSH) {
              d->m_dict_size = 0;
              switchD_016d8eb1::default(__s,0,0x20000);
            }
          }
        }
        tVar10 = tdefl_flush_output_buffer(d);
        d->m_prev_return_status = tVar10;
        return tVar10;
      }
      goto LAB_01b335c7;
    }
  }
  else {
LAB_01b335c7:
    if (pIn_buf_size == (size_t *)0x0) goto LAB_01b335d0;
  }
  *pIn_buf_size = 0;
LAB_01b335d0:
  if (pOut_buf_size != (size_t *)0x0) {
    *pOut_buf_size = 0;
  }
  d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM;
  return TDEFL_STATUS_BAD_PARAM;
}

Assistant:

tdefl_status tdefl_compress(tdefl_compressor *d, const void *pIn_buf, size_t *pIn_buf_size, void *pOut_buf, size_t *pOut_buf_size, tdefl_flush flush)
{
    if (!d)
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return TDEFL_STATUS_BAD_PARAM;
    }

    d->m_pIn_buf = pIn_buf;
    d->m_pIn_buf_size = pIn_buf_size;
    d->m_pOut_buf = pOut_buf;
    d->m_pOut_buf_size = pOut_buf_size;
    d->m_pSrc = (const mz_uint8 *)(pIn_buf);
    d->m_src_buf_left = pIn_buf_size ? *pIn_buf_size : 0;
    d->m_out_buf_ofs = 0;
    d->m_flush = flush;

    if (((d->m_pPut_buf_func != NULL) == ((pOut_buf != NULL) || (pOut_buf_size != NULL))) || (d->m_prev_return_status != TDEFL_STATUS_OKAY) ||
        (d->m_wants_to_finish && (flush != TDEFL_FINISH)) || (pIn_buf_size && *pIn_buf_size && !pIn_buf) || (pOut_buf_size && *pOut_buf_size && !pOut_buf))
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return (d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM);
    }
    d->m_wants_to_finish |= (flush == TDEFL_FINISH);

    if ((d->m_output_flush_remaining) || (d->m_finished))
        return (d->m_prev_return_status = tdefl_flush_output_buffer(d));

#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
    if (((d->m_flags & TDEFL_MAX_PROBES_MASK) == 1) &&
        ((d->m_flags & TDEFL_GREEDY_PARSING_FLAG) != 0) &&
        ((d->m_flags & (TDEFL_FILTER_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS | TDEFL_RLE_MATCHES)) == 0))
    {
        if (!tdefl_compress_fast(d))
            return d->m_prev_return_status;
    }
    else
#endif /* #if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN */
    {
        if (!tdefl_compress_normal(d))
            return d->m_prev_return_status;
    }

    if ((d->m_flags & (TDEFL_WRITE_ZLIB_HEADER | TDEFL_COMPUTE_ADLER32)) && (pIn_buf))
        d->m_adler32 = (mz_uint32)mz_adler32(d->m_adler32, (const mz_uint8 *)pIn_buf, d->m_pSrc - (const mz_uint8 *)pIn_buf);

    if ((flush) && (!d->m_lookahead_size) && (!d->m_src_buf_left) && (!d->m_output_flush_remaining))
    {
        if (tdefl_flush_block(d, flush) < 0)
            return d->m_prev_return_status;
        d->m_finished = (flush == TDEFL_FINISH);
        if (flush == TDEFL_FULL_FLUSH)
        {
            MZ_CLEAR_OBJ(d->m_hash);
            MZ_CLEAR_OBJ(d->m_next);
            d->m_dict_size = 0;
        }
    }

    return (d->m_prev_return_status = tdefl_flush_output_buffer(d));
}